

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O0

void __thiscall
enact::LogicalExpr::LogicalExpr
          (LogicalExpr *this,unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *left,
          unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *right,Token *oper)

{
  Token *oper_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *right_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *left_local;
  LogicalExpr *this_local;
  
  Expr::Expr(&this->super_Expr);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__LogicalExpr_0016a528;
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr(&this->left,left);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr(&this->right,right);
  Token::Token(&this->oper,oper);
  return;
}

Assistant:

LogicalExpr(std::unique_ptr<Expr> left, std::unique_ptr<Expr> right, Token oper) :
                left{std::move(left)},
                right{std::move(right)},
                oper{std::move(oper)} {}